

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

void cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)

{
  cJSON *pcVar1;
  
  if (-1 < which) {
    pcVar1 = get_array_item(array,(ulong)(uint)which);
    if (pcVar1 == (cJSON *)0x0) {
      cJSON_AddItemToArray(array,newitem);
      return;
    }
    newitem->next = pcVar1;
    newitem->prev = pcVar1->prev;
    pcVar1->prev = newitem;
    if (pcVar1 == array->child) {
      array->child = newitem;
    }
    else {
      newitem->prev->next = newitem;
    }
  }
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_InsertItemInArray(cJSON *array, int which, cJSON *newitem)
{
    cJSON *after_inserted = NULL;

    if (which < 0)
    {
        return;
    }

    after_inserted = get_array_item(array, (size_t)which);
    if (after_inserted == NULL)
    {
        cJSON_AddItemToArray(array, newitem);
        return;
    }

    newitem->next = after_inserted;
    newitem->prev = after_inserted->prev;
    after_inserted->prev = newitem;
    if (after_inserted == array->child)
    {
        array->child = newitem;
    }
    else
    {
        newitem->prev->next = newitem;
    }
}